

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::lsplit_path
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,libtorrent *this,string_view p)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  size_type __n;
  ulong uVar4;
  char *__s;
  
  if (this == (libtorrent *)0x0) {
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
  }
  else {
    uVar4 = (ulong)(*(char *)p._M_len == '/');
    __s = (char *)p._M_len + uVar4;
    uVar4 = (long)this - uVar4;
    if (uVar4 == 0) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      pvVar2 = memchr(__s,0x2f,uVar4);
      uVar3 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
    }
    if (uVar3 == 0xffffffffffffffff) {
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      (__return_storage_ptr__->first)._M_len = uVar4;
      (__return_storage_ptr__->first)._M_str = __s;
    }
    else {
      lVar1 = uVar3 + 1;
      if (uVar4 <= uVar3) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   lVar1,uVar4);
      }
      (__return_storage_ptr__->first)._M_len = uVar3;
      (__return_storage_ptr__->first)._M_str = __s;
      (__return_storage_ptr__->second)._M_len = uVar4 - lVar1;
      (__return_storage_ptr__->second)._M_str = __s + lVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> lsplit_path(string_view p)
	{
		if (p.empty()) return {{}, {}};
		// for absolute paths, skip the initial "/"
		if (p.front() == TORRENT_SEPARATOR_CHAR) p.remove_prefix(1);
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		else if (p.front() == '/') p.remove_prefix(1);
#endif
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		auto const sep = p.find_first_of("/\\");
#else
		auto const sep = p.find_first_of(TORRENT_SEPARATOR_CHAR);
#endif
		if (sep == string_view::npos) return {p, {}};
		return { p.substr(0, sep), p.substr(sep + 1) };
	}